

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

Instruction * __thiscall spvtools::opt::Pass::GetBaseType(Pass *this,uint32_t ty_id)

{
  Op OVar1;
  uint32_t uVar2;
  DefUseManager *pDVar3;
  uint32_t cty_id;
  uint32_t vty_id;
  Instruction *ty_inst;
  uint32_t ty_id_local;
  Pass *this_local;
  
  pDVar3 = get_def_use_mgr(this);
  _cty_id = analysis::DefUseManager::GetDef(pDVar3,ty_id);
  OVar1 = opt::Instruction::opcode(_cty_id);
  if (OVar1 == OpTypeMatrix) {
    uVar2 = opt::Instruction::GetSingleWordInOperand(_cty_id,0);
    pDVar3 = get_def_use_mgr(this);
    _cty_id = analysis::DefUseManager::GetDef(pDVar3,uVar2);
  }
  OVar1 = opt::Instruction::opcode(_cty_id);
  if (OVar1 == OpTypeVector) {
    uVar2 = opt::Instruction::GetSingleWordInOperand(_cty_id,0);
    pDVar3 = get_def_use_mgr(this);
    _cty_id = analysis::DefUseManager::GetDef(pDVar3,uVar2);
  }
  return _cty_id;
}

Assistant:

Instruction* Pass::GetBaseType(uint32_t ty_id) {
  Instruction* ty_inst = get_def_use_mgr()->GetDef(ty_id);
  if (ty_inst->opcode() == spv::Op::OpTypeMatrix) {
    uint32_t vty_id = ty_inst->GetSingleWordInOperand(0);
    ty_inst = get_def_use_mgr()->GetDef(vty_id);
  }
  if (ty_inst->opcode() == spv::Op::OpTypeVector) {
    uint32_t cty_id = ty_inst->GetSingleWordInOperand(0);
    ty_inst = get_def_use_mgr()->GetDef(cty_id);
  }
  return ty_inst;
}